

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall CPlayer::UpdateDeadSpecMode(CPlayer *this)

{
  bool bVar1;
  CGameContext *pCVar2;
  CPlayer *in_RDI;
  CPlayer *unaff_retaddr;
  int i;
  int local_c;
  CPlayer *pPlayer;
  
  pPlayer = in_RDI;
  if ((in_RDI->m_SpectatorID != -1) &&
     (pCVar2 = GameServer(in_RDI), pCVar2->m_apPlayers[in_RDI->m_SpectatorID] != (CPlayer *)0x0)) {
    GameServer(in_RDI);
    bVar1 = DeadCanFollow(unaff_retaddr,pPlayer);
    if (bVar1) {
      return;
    }
  }
  local_c = 0;
  do {
    if (0x3f < local_c) {
      in_RDI->m_DeadSpecMode = false;
      return;
    }
    pCVar2 = GameServer(in_RDI);
    if (pCVar2->m_apPlayers[local_c] != (CPlayer *)0x0) {
      GameServer(in_RDI);
      bVar1 = DeadCanFollow(unaff_retaddr,pPlayer);
      if (bVar1) {
        in_RDI->m_SpectatorID = local_c;
        return;
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void CPlayer::UpdateDeadSpecMode()
{
	// check if actual spectator id is valid
	if(m_SpectatorID != -1 && GameServer()->m_apPlayers[m_SpectatorID] && DeadCanFollow(GameServer()->m_apPlayers[m_SpectatorID]))
		return;

	// find player to follow
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(GameServer()->m_apPlayers[i] && DeadCanFollow(GameServer()->m_apPlayers[i]))
		{
			m_SpectatorID = i;
			return;
		}
	}

	// no one available to follow -> turn spectator mode off
	m_DeadSpecMode = false;
}